

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

int indexof(ctmbstr item,ctmbstr *list)

{
  int iVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  
  iVar2 = -1;
  if (list != (ctmbstr *)0x0) {
    uVar3 = 0;
    while( true ) {
      iVar2 = -1;
      if ((list[uVar3] == (ctmbstr)0x0) ||
         (iVar1 = prvTidytmbstrcasecmp(item,list[uVar3]), iVar2 = (int)uVar3, iVar1 == 0)) break;
      uVar3 = (ulong)((int)uVar3 + 1);
    }
  }
  return iVar2;
}

Assistant:

static
int indexof( ctmbstr item, ctmbstr *list )
{
    if ( list )
    {
        uint i = 0;
        while ( list[i] != NULL ) {
            if ( TY_(tmbstrcasecmp)(item, list[i]) == 0 )
                return i;
            i++;
        }
    }

    return -1;
}